

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_arith_imm(DisasContext_conflict6 *ctx,uint32_t opc,int rt,int rs,int imm)

{
  TCGContext_conflict6 *s;
  TCGContext_conflict6 *pTVar1;
  uintptr_t o_3;
  TCGTemp *pTVar2;
  TCGTemp *pTVar3;
  TCGTemp *pTVar4;
  TCGLabel *pTVar5;
  TCGv_i32 pTVar6;
  TCGArg a2;
  TCGv_i64 pTVar7;
  TCGOpcode TVar8;
  uintptr_t o_5;
  TCGv_i64 pTVar9;
  uintptr_t o_1;
  uintptr_t o_2;
  TCGv_i64 pTVar10;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (rt == 0 && (opc & 0xbfffffff) != 0x20000000) {
    return;
  }
  s = ctx->uc->tcg_ctx;
  a2 = (TCGArg)imm;
  if (0x5fffffff < (int)opc) {
    if (opc != 0x60000000) {
      if (opc != 0x64000000) {
        return;
      }
      pTVar9 = s->cpu_gpr[rt];
      if (rs != 0) {
        tcg_gen_addi_i64_mips64el(s,pTVar9,s->cpu_gpr[rs],a2);
        return;
      }
      goto LAB_0097e743;
    }
    pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
    pTVar9 = (TCGv_i64)((long)pTVar2 - (long)s);
    pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar10 = (TCGv_i64)((long)pTVar3 - (long)s);
    pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
    pTVar5 = gen_new_label_mips64el(s);
    if (rs == 0) {
      TVar8 = INDEX_op_movi_i64;
      pTVar7 = (TCGv_i64)0x0;
LAB_0097e8d3:
      tcg_gen_op2_mips64el(s,TVar8,(TCGArg)pTVar3,(TCGArg)pTVar7);
    }
    else if (s->cpu_gpr[rs] != pTVar10) {
      pTVar7 = s->cpu_gpr[rs] + (long)s;
      TVar8 = INDEX_op_mov_i64;
      goto LAB_0097e8d3;
    }
    tcg_gen_addi_i64_mips64el(s,pTVar9,pTVar10,a2);
    tcg_gen_xori_i64_mips64el(s,pTVar10,pTVar10,~a2);
    tcg_gen_xori_i64_mips64el(s,(TCGv_i64)((long)pTVar4 - (long)s),pTVar9,a2);
    tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar3,(TCGArg)pTVar3,(TCGArg)pTVar4);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s) + (long)s));
    tcg_gen_brcondi_i64_mips64el(s,TCG_COND_GE,pTVar10,0,pTVar5);
    tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar10 + (long)s));
    pTVar1 = ctx->uc->tcg_ctx;
    pTVar6 = tcg_const_i32_mips64el(pTVar1,0x15);
    local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
    local_40 = (TCGTemp *)(pTVar6 + (long)pTVar1);
    tcg_gen_callN_mips64el(pTVar1,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_48);
    tcg_temp_free_internal_mips64el(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
    *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
    tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar5);
    if ((rt != 0) && (s->cpu_gpr[rt] != pTVar9)) {
      tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rt] + (long)s),(TCGArg)pTVar2);
    }
    goto LAB_0097ea14;
  }
  if (opc != 0x20000000) {
    if (opc != 0x24000000) {
      return;
    }
    pTVar9 = s->cpu_gpr[rt];
    if (rs != 0) {
      tcg_gen_addi_i64_mips64el(s,pTVar9,s->cpu_gpr[rs],a2);
      tcg_gen_ext32s_i64_mips64el(s,s->cpu_gpr[rt],s->cpu_gpr[rt]);
      return;
    }
LAB_0097e743:
    tcg_gen_op2_mips64el(s,INDEX_op_movi_i64,(TCGArg)(pTVar9 + (long)s),a2);
    return;
  }
  pTVar2 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,true);
  pTVar9 = (TCGv_i64)((long)pTVar2 - (long)s);
  pTVar3 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar10 = (TCGv_i64)((long)pTVar3 - (long)s);
  pTVar4 = tcg_temp_new_internal_mips64el(s,TCG_TYPE_I64,false);
  pTVar5 = gen_new_label_mips64el(s);
  if (rs == 0) {
    TVar8 = INDEX_op_movi_i64;
    pTVar7 = (TCGv_i64)0x0;
LAB_0097e773:
    tcg_gen_op2_mips64el(s,TVar8,(TCGArg)pTVar3,(TCGArg)pTVar7);
  }
  else if (s->cpu_gpr[rs] != pTVar10) {
    pTVar7 = s->cpu_gpr[rs] + (long)s;
    TVar8 = INDEX_op_mov_i64;
    goto LAB_0097e773;
  }
  tcg_gen_addi_i64_mips64el(s,pTVar9,pTVar10,a2);
  tcg_gen_ext32s_i64_mips64el(s,pTVar9,pTVar9);
  tcg_gen_xori_i64_mips64el(s,pTVar10,pTVar10,~a2);
  tcg_gen_xori_i64_mips64el(s,(TCGv_i64)((long)pTVar4 - (long)s),pTVar9,a2);
  tcg_gen_op3_mips64el(s,INDEX_op_and_i64,(TCGArg)pTVar3,(TCGArg)pTVar3,(TCGArg)pTVar4);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)((TCGv_i64)((long)pTVar4 - (long)s) + (long)s));
  tcg_gen_brcondi_i64_mips64el(s,TCG_COND_GE,pTVar10,0,pTVar5);
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar10 + (long)s));
  pTVar1 = ctx->uc->tcg_ctx;
  pTVar6 = tcg_const_i32_mips64el(pTVar1,0x15);
  local_48 = (TCGTemp *)(pTVar1->cpu_env + (long)pTVar1);
  local_40 = (TCGTemp *)(pTVar6 + (long)pTVar1);
  tcg_gen_callN_mips64el(pTVar1,helper_raise_exception_mips64el,(TCGTemp *)0x0,2,&local_48);
  tcg_temp_free_internal_mips64el(pTVar1,(TCGTemp *)(pTVar6 + (long)pTVar1));
  *(byte *)pTVar5 = *(byte *)pTVar5 | 1;
  tcg_gen_op1_mips64el(s,INDEX_op_set_label,(TCGArg)pTVar5);
  tcg_gen_ext32s_i64_mips64el(s,pTVar9,pTVar9);
  if ((rt != 0) && (s->cpu_gpr[rt] != pTVar9)) {
    tcg_gen_op2_mips64el(s,INDEX_op_mov_i64,(TCGArg)(s->cpu_gpr[rt] + (long)s),(TCGArg)pTVar2);
  }
LAB_0097ea14:
  tcg_temp_free_internal_mips64el(s,(TCGTemp *)(pTVar9 + (long)s));
  return;
}

Assistant:

static void gen_arith_imm(DisasContext *ctx, uint32_t opc,
                          int rt, int rs, int imm)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    target_ulong uimm = (target_long)imm; /* Sign extend to 32/64 bits */

    if (rt == 0 && opc != OPC_ADDI && opc != OPC_DADDI) {
        /*
         * If no destination, treat it as a NOP.
         * For addi, we must generate the overflow exception when needed.
         */
        return;
    }
    switch (opc) {
    case OPC_ADDI:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            tcg_gen_addi_tl(tcg_ctx, t0, t1, uimm);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);

            tcg_gen_xori_tl(tcg_ctx, t1, t1, ~uimm);
            tcg_gen_xori_tl(tcg_ctx, t2, t0, uimm);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            tcg_gen_ext32s_tl(tcg_ctx, t0, t0);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_ADDIU:
        if (rs != 0) {
            tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rt]);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
#if defined(TARGET_MIPS64)
    case OPC_DADDI:
        {
            TCGv t0 = tcg_temp_local_new(tcg_ctx);
            TCGv t1 = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGLabel *l1 = gen_new_label(tcg_ctx);

            gen_load_gpr(tcg_ctx, t1, rs);
            tcg_gen_addi_tl(tcg_ctx, t0, t1, uimm);

            tcg_gen_xori_tl(tcg_ctx, t1, t1, ~uimm);
            tcg_gen_xori_tl(tcg_ctx, t2, t0, uimm);
            tcg_gen_and_tl(tcg_ctx, t1, t1, t2);
            tcg_temp_free(tcg_ctx, t2);
            tcg_gen_brcondi_tl(tcg_ctx, TCG_COND_GE, t1, 0, l1);
            tcg_temp_free(tcg_ctx, t1);
            /* operands of same sign, result different sign */
            generate_exception(ctx, EXCP_OVERFLOW);
            gen_set_label(tcg_ctx, l1);
            gen_store_gpr(tcg_ctx, t0, rt);
            tcg_temp_free(tcg_ctx, t0);
        }
        break;
    case OPC_DADDIU:
        if (rs != 0) {
            tcg_gen_addi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], tcg_ctx->cpu_gpr[rs], uimm);
        } else {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr[rt], uimm);
        }
        break;
#endif
    }
}